

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O0

void __thiscall Integer::display(Integer *this)

{
  ostream *poVar1;
  Integer *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"cited: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Data).cited);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"type : Integer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"value: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Integer::display() {
    std::cout << "cited: " << cited << std::endl;
    std::cout << "type : Integer" << std::endl;
    std::cout << "value: " << value << std::endl;
    std::cout << std::endl;
}